

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void delete_edge(edge_t_conflict e)

{
  edge_t_conflict e_local;
  
  DLIST_out_edge_t_remove(&e->src->out_edges,e);
  DLIST_in_edge_t_remove(&e->dst->in_edges,e);
  free(e);
  return;
}

Assistant:

static void delete_edge (edge_t e) {
  DLIST_REMOVE (out_edge_t, e->src->out_edges, e);
  DLIST_REMOVE (in_edge_t, e->dst->in_edges, e);
  free (e);
}